

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O0

Am_Object Am_Create_Screen(char *display_name)

{
  bool value;
  Am_Wrapper *value_00;
  Am_Object *pAVar1;
  char *in_RSI;
  Am_Object local_70;
  Am_Object_Advanced local_68;
  Am_Object_Advanced temp;
  Am_Value local_58 [2];
  Am_Object local_38;
  byte local_29;
  int local_28;
  int local_24;
  int height;
  int width;
  Am_Drawonable *new_root;
  char *display_name_local;
  Am_Object *new_screen;
  
  display_name_local = display_name;
  _height = Am_Drawonable::Get_Root_Drawonable(in_RSI);
  if (_height == (Am_Drawonable *)0x0) {
    Am_Object::Am_Object((Am_Object *)display_name,(Am_Object_Data *)0x0);
  }
  else {
    Am_Drawonable::Get_Size(_height,&local_24,&local_28);
    local_29 = 0;
    Am_Object::Create(&local_38,(char *)&Am_Screen);
    value_00 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_Screen);
    pAVar1 = Am_Object::Set(&local_38,0x7d5,value_00,1);
    Am_Am_Drawonable::Am_Am_Drawonable((Am_Am_Drawonable *)&temp,_height);
    Am_Am_Drawonable::operator_cast_to_Am_Value((Am_Am_Drawonable *)local_58);
    pAVar1 = Am_Object::Set(pAVar1,0x7d2,local_58,1);
    pAVar1 = Am_Object::Set(pAVar1,0x66,local_24,0);
    pAVar1 = Am_Object::Set(pAVar1,0x67,local_28,0);
    Am_Object::Am_Object((Am_Object *)display_name,pAVar1);
    Am_Value::~Am_Value(local_58);
    Am_Object::~Am_Object(&local_38);
    Am_Object_Advanced::Am_Object_Advanced(&local_68,(Am_Object_Advanced *)display_name);
    Am_Object::Am_Object(&local_70,(Am_Object *)display_name);
    value = screen_is_color(&local_70);
    Am_Object::Set((Am_Object *)display_name,0x87,value,0);
    Am_Object::~Am_Object(&local_70);
    local_29 = 1;
    Am_Object_Advanced::~Am_Object_Advanced(&local_68);
    if ((local_29 & 1) == 0) {
      Am_Object::~Am_Object((Am_Object *)display_name);
    }
  }
  return (Am_Object)(Am_Object_Data *)display_name;
}

Assistant:

Am_Object
Am_Create_Screen(const char *display_name)
{
  Am_Drawonable *new_root = Am_Drawonable::Get_Root_Drawonable(display_name);
  if (!new_root)
    return nullptr;
  int width, height;
  new_root->Get_Size(width, height);
  Am_Object new_screen =
      Am_Screen.Create(display_name)
          .Set(Am_SCREEN, Am_Screen, Am_OK_IF_NOT_THERE)
          .Set(Am_DRAWONABLE, (Am_Am_Drawonable)new_root, Am_OK_IF_NOT_THERE)
          .Set(Am_WIDTH, width)
          .Set(Am_HEIGHT, height);
  Am_Object_Advanced temp = (Am_Object_Advanced &)new_screen;
  //// NDY Create other slots that Am_Screen ought to have
  new_screen.Set(Am_IS_COLOR, screen_is_color(new_screen));
  return new_screen;
}